

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O3

LispPTR arrayblockmerger(LispPTR base,LispPTR nbase)

{
  DLword length;
  DLword *pDVar1;
  short sVar2;
  LispPTR LVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  
  if ((base & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)base);
  }
  pDVar1 = Lisp_world;
  if ((nbase & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)nbase);
  }
  uVar7 = pDVar1[base];
  uVar4 = Lisp_world[nbase];
  uVar6 = ~uVar7;
  if (base + (uint)uVar7 * 2 != nbase) {
    error("Attempt to merge non-adjacent blocks in array space\n");
  }
  if (uVar6 < uVar4) {
    uVar4 = uVar4 - uVar6;
    uVar5 = 4;
    if (*Hunk_word == 0x4c) {
      uVar5 = 0x42;
    }
    sVar2 = uVar4 - uVar5;
    length = uVar5;
    if (uVar5 < uVar4) {
      length = uVar4;
    }
    uVar7 = sVar2 - 1;
    if (uVar5 <= uVar4) {
      sVar2 = 0;
      uVar7 = 0xffff;
    }
    LVar3 = nbase + (uint)(ushort)(sVar2 + uVar6) * 2;
    makefreearrayblock(LVar3,length);
    linkblock(LVar3);
    uVar4 = 0;
  }
  makefreearrayblock(base,uVar7 + uVar4);
  LVar3 = linkblock(base);
  return LVar3;
}

Assistant:

LispPTR arrayblockmerger(LispPTR base, LispPTR nbase) {
  DLword arlens, narlens, secondbite, minblocksize, shaveback;
  struct arrayblock *bbase, *bnbase;
  bbase = (struct arrayblock *)NativeAligned4FromLAddr(base);
  bnbase = (struct arrayblock *)NativeAligned4FromLAddr(nbase);
  arlens = bbase->arlen;
  narlens = bnbase->arlen;
  secondbite = MAXARRAYBLOCKSIZE - arlens;
  /* There are three cases for merging the blocks
   * (1) the total size of the two blocks is less than max:
   *     merge into a single block
   * (2) creating a max size block leaves a viable leftover block:
   *     move the boundary to make a max block and a leftover block
   * (3) creating a max size block leaves a non-viable leftover block
   *     move the boundary to make a big block and a minimum size leftover block
   */
  if (base + (2 * arlens) != nbase) {
    error("Attempt to merge non-adjacent blocks in array space\n");
  }
  if (narlens > secondbite) { /* (2) or (3) */
    arlens = MAXARRAYBLOCKSIZE;
    narlens = narlens - secondbite;
    minblocksize =
        ((*Hunk_word == ATOM_T) ? (ARRAYBLOCKOVERHEADCELLS + MAXCELLSPERHUNK) : MINARRAYBLOCKSIZE);
    if (narlens < minblocksize) { /* (3) */
      shaveback = narlens - minblocksize;
      narlens = minblocksize;
      arlens += shaveback;
      secondbite += shaveback;
    }
    linkblock(makefreearrayblock(nbase + 2 * secondbite, narlens));
    narlens = 0;
  }
  return (linkblock(makefreearrayblock(base, arlens + narlens)));
}